

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

auto_ptr<cmFunctionBlocker> __thiscall
cmMakefile::RemoveFunctionBlocker(cmMakefile *this,cmFunctionBlocker *fb,cmListFileFunction *lff)

{
  string *psVar1;
  size_type sVar2;
  long lVar3;
  pointer pcVar4;
  cmListFileFunction *pcVar5;
  char cVar6;
  ulong uVar7;
  ostream *poVar8;
  cmCommandContext *in_RCX;
  ulong uVar9;
  undefined8 uVar10;
  ulong uVar11;
  pointer __src;
  long lVar12;
  cmListFileContext closingContext;
  ostringstream e;
  string local_210;
  cmListFileContext local_1f0;
  undefined1 local_1a8 [376];
  
  sVar2 = *(size_type *)((long)&fb[7].StartingContext.FilePath.field_2 + 8);
  if (fb[7].StartingContext.FilePath.field_2._M_allocated_capacity == sVar2) {
    uVar7 = 0;
  }
  else {
    uVar7 = *(ulong *)(sVar2 - 8);
  }
  lVar3 = *(long *)((long)&fb[7].StartingContext.Name.field_2 + 8);
  pcVar4 = fb[7].StartingContext.FilePath._M_dataplus._M_p;
  uVar11 = (long)pcVar4 - lVar3 >> 3;
  uVar10 = 0;
  lVar12 = 0;
  uVar9 = uVar11;
  do {
    if (uVar9 <= uVar7) goto LAB_0039f64e;
    uVar9 = uVar9 - 1;
    pcVar5 = *(cmListFileFunction **)(pcVar4 + lVar12 + -8);
    lVar12 = lVar12 + -8;
  } while (pcVar5 != lff);
  cVar6 = (**(code **)((pcVar5->super_cmCommandContext).Name._M_dataplus._M_p + 8))();
  if (cVar6 == '\0') {
    cmListFileContext::FromCommandContext(&local_1f0,in_RCX,(string *)&lff->Arguments);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"A logical block opening on the line\n",0x24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  ",2);
    poVar8 = operator<<((ostream *)local_1a8,
                        (cmListFileContext *)&(lff->super_cmCommandContext).Name._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"closes on the line\n",0x13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  ",2);
    poVar8 = operator<<(poVar8,&local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"with mis-matching arguments.",0x1c);
    std::__cxx11::stringbuf::str();
    IssueMessage((cmMakefile *)fb,AUTHOR_WARNING,&local_210,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.FilePath._M_dataplus._M_p != &local_1f0.FilePath.field_2) {
      operator_delete(local_1f0.FilePath._M_dataplus._M_p,
                      local_1f0.FilePath.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.Name._M_dataplus._M_p != &local_1f0.Name.field_2) {
      operator_delete(local_1f0.Name._M_dataplus._M_p,
                      local_1f0.Name.field_2._M_allocated_capacity + 1);
    }
  }
  lVar3 = lVar3 + uVar11 * 8;
  uVar10 = *(undefined8 *)(lVar3 + lVar12);
  __src = (pointer)(lVar3 + lVar12 + 8);
  pcVar4 = fb[7].StartingContext.FilePath._M_dataplus._M_p;
  if (__src != pcVar4) {
    memmove((void *)(lVar3 + lVar12),__src,(size_t)(pcVar4 + (-lVar12 - lVar3) + -8));
  }
  psVar1 = &fb[7].StartingContext.FilePath;
  (psVar1->_M_dataplus)._M_p = (psVar1->_M_dataplus)._M_p + -8;
LAB_0039f64e:
  *(undefined8 *)&(this->CMP0054ReportedIds)._M_t._M_impl = uVar10;
  return (auto_ptr<cmFunctionBlocker>)(cmFunctionBlocker *)this;
}

Assistant:

cmsys::auto_ptr<cmFunctionBlocker>
cmMakefile::RemoveFunctionBlocker(cmFunctionBlocker* fb,
                                  const cmListFileFunction& lff)
{
  // Find the function blocker stack barrier for the current scope.
  // We only remove a blocker whose index is not less than the barrier.
  FunctionBlockersType::size_type barrier = 0;
  if(!this->FunctionBlockerBarriers.empty())
    {
    barrier = this->FunctionBlockerBarriers.back();
    }

  // Search for the function blocker whose scope this command ends.
  for(FunctionBlockersType::size_type
        i = this->FunctionBlockers.size(); i > barrier; --i)
    {
    std::vector<cmFunctionBlocker*>::iterator pos =
      this->FunctionBlockers.begin() + (i - 1);
    if (*pos == fb)
      {
      // Warn if the arguments do not match, but always remove.
      if(!(*pos)->ShouldRemove(lff, *this))
        {
        cmListFileContext const& lfc = fb->GetStartingContext();
        cmListFileContext closingContext =
            cmListFileContext::FromCommandContext(lff, lfc.FilePath);
        std::ostringstream e;
        e << "A logical block opening on the line\n"
          << "  " << lfc << "\n"
          << "closes on the line\n"
          << "  " << closingContext << "\n"
          << "with mis-matching arguments.";
        this->IssueMessage(cmake::AUTHOR_WARNING, e.str());
        }
      cmFunctionBlocker* b = *pos;
      this->FunctionBlockers.erase(pos);
      return cmsys::auto_ptr<cmFunctionBlocker>(b);
      }
    }

  return cmsys::auto_ptr<cmFunctionBlocker>();
}